

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawSplineSegmentBezierQuadratic(Vector2 p1,Vector2 c2,Vector2 p3,float thick,Color color)

{
  int iVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_240;
  float local_23c;
  float local_238;
  float local_234;
  float local_208;
  float local_1f8;
  float fStack_1f4;
  float local_1e8;
  float fStack_1e4;
  float afStack_1c4 [3];
  Vector2 local_1b8;
  float local_1b0;
  float local_1ac;
  float afStack_1a8 [98];
  
  memset(&local_1b8,0,400);
  fStack_1f4 = c2.y;
  fStack_1e4 = p3.y;
  local_23c = local_1b8.y;
  local_238 = local_1b0;
  lVar2 = 0x1c;
  iVar1 = 1;
  local_234 = local_1ac;
  local_208 = p1.x;
  local_240 = 0.0;
  afStack_1c4[0] = fStack_1f4;
  afStack_1c4[1] = fStack_1f4;
  afStack_1c4[2] = fStack_1f4;
  fVar7 = p1.y;
  fVar8 = local_208;
  do {
    fVar6 = (float)iVar1 * 0.041666668;
    fVar3 = 1.0 - fVar6;
    fVar4 = (fVar3 + fVar3) * fVar6;
    fVar5 = fVar6 * fVar6 * fStack_1e4 + fVar3 * fVar3 * p1.y + fStack_1f4 * fVar4;
    local_1f8 = c2.x;
    local_1e8 = p3.x;
    fVar6 = fVar6 * fVar6 * local_1e8 + fVar3 * fVar3 * local_208 + fVar4 * local_1f8;
    fVar4 = fVar5 - fVar7;
    fVar9 = fVar6 - fVar8;
    fVar3 = fVar9 * fVar9 + fVar4 * fVar4;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    fVar3 = (thick * 0.5) / fVar3;
    fVar4 = fVar4 * fVar3;
    fVar9 = fVar9 * fVar3;
    if (lVar2 == 0x1c) {
      local_240 = fVar4 + fVar8;
      local_238 = fVar8 - fVar4;
      local_234 = fVar9 + fVar7;
      local_23c = fVar7 - fVar9;
    }
    *(float *)((long)afStack_1c4 + lVar2 + 8) = fVar6 - fVar4;
    *(float *)((long)&local_1b8.x + lVar2) = fVar9 + fVar5;
    *(float *)((long)afStack_1c4 + lVar2) = fVar4 + fVar6;
    *(float *)((long)afStack_1c4 + lVar2 + 4) = fVar5 - fVar9;
    lVar2 = lVar2 + 0x10;
    iVar1 = iVar1 + 1;
    fVar7 = fVar5;
    fVar8 = fVar6;
  } while (lVar2 != 0x19c);
  local_1b8.y = local_23c;
  local_1b0 = local_238;
  local_1ac = local_234;
  local_1b8.x = local_240;
  DrawTriangleStrip(&local_1b8,0x32,color);
  return;
}

Assistant:

void DrawSplineSegmentBezierQuadratic(Vector2 p1, Vector2 c2, Vector2 p3, float thick, Color color)
{
    const float step = 1.0f/SPLINE_SEGMENT_DIVISIONS;

    Vector2 previous = p1;
    Vector2 current = { 0 };
    float t = 0.0f;

    Vector2 points[2*SPLINE_SEGMENT_DIVISIONS + 2] = { 0 };

    for (int i = 1; i <= SPLINE_SEGMENT_DIVISIONS; i++)
    {
        t = step*(float)i;

        float a = powf(1.0f - t, 2);
        float b = 2.0f*(1.0f - t)*t;
        float c = powf(t, 2);

        // NOTE: The easing functions aren't suitable here because they don't take a control point
        current.y = a*p1.y + b*c2.y + c*p3.y;
        current.x = a*p1.x + b*c2.x + c*p3.x;

        float dy = current.y - previous.y;
        float dx = current.x - previous.x;
        float size = 0.5f*thick/sqrtf(dx*dx+dy*dy);

        if (i == 1)
        {
            points[0].x = previous.x + dy*size;
            points[0].y = previous.y - dx*size;
            points[1].x = previous.x - dy*size;
            points[1].y = previous.y + dx*size;
        }

        points[2*i + 1].x = current.x - dy*size;
        points[2*i + 1].y = current.y + dx*size;
        points[2*i].x = current.x + dy*size;
        points[2*i].y = current.y - dx*size;

        previous = current;
    }

    DrawTriangleStrip(points, 2*SPLINE_SEGMENT_DIVISIONS + 2, color);
}